

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall CLayerGroup::DeleteLayer(CLayerGroup *this,int Index)

{
  CLayer *pCVar1;
  
  if ((-1 < Index) && (Index < (this->m_lLayers).num_elements)) {
    pCVar1 = (this->m_lLayers).list[(uint)Index];
    if (pCVar1 != (CLayer *)0x0) {
      (*pCVar1->_vptr_CLayer[1])();
    }
    array<CLayer_*,_allocator_default<CLayer_*>_>::remove_index(&this->m_lLayers,Index);
    this->m_pMap->m_Modified = true;
  }
  return;
}

Assistant:

void CLayerGroup::DeleteLayer(int Index)
{
	if(Index < 0 || Index >= m_lLayers.size()) return;
	delete m_lLayers[Index];
	m_lLayers.remove_index(Index);
	m_pMap->m_Modified = true;
}